

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O3

void __thiscall
avro::parsing::SimpleParser<avro::parsing::JsonHandler>::setRepeatCount
          (SimpleParser<avro::parsing::JsonHandler> *this,size_t n)

{
  tuple<unsigned_long,_bool,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::shared_ptr<std::vector<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>_>,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type,_boost::tuples::null_type>
  *ptVar1;
  undefined8 *puVar2;
  _Elt_pointer pSVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pSVar3 = (this->parsingStack).c.
           super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar3 == (this->parsingStack).c.
                super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    pSVar3 = (this->parsingStack).c.
             super__Deque_base<avro::parsing::Symbol,_std::allocator<avro::parsing::Symbol>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
  }
  if (pSVar3[-1].kind_ != sRepeater) {
    throwMismatch(sRepeater,pSVar3[-1].kind_);
  }
  ptVar1 = boost::
           any_cast<boost::tuples::tuple<unsigned_long,bool,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::shared_ptr<std::vector<avro::parsing::Symbol,std::allocator<avro::parsing::Symbol>>>,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>>
                     (&pSVar3[-1].extra_);
  if ((ptVar1->super_type).head == 0) {
    (ptVar1->super_type).head = n;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Wrong number of items","");
  std::runtime_error::runtime_error((runtime_error *)(puVar2 + 1),(string *)local_40);
  *puVar2 = 0x1cc910;
  puVar2[1] = 0x1cc940;
  __cxa_throw(puVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void setRepeatCount(size_t n) {
        Symbol& s = parsingStack.top();
        assertMatch(Symbol::sRepeater, s.kind());
        size_t& nn = boost::tuples::get<0>(*s.extrap<RepeaterInfo>());
        if (nn != 0) {
            throw Exception("Wrong number of items");
        }
        nn = n;
    }